

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tristrip.cpp
# Opt level: O0

void rw::printNode(StripMesh *sm,StripNode *n)

{
  StripNode *n_local;
  StripMesh *sm_local;
  
  return;
}

Assistant:

static void
printNode(StripMesh *sm, StripNode *n)
{
	trace("%3ld: %3d  %3d.%d  %3d.%d %3d.%d || %3d %3d %3d\n",
		n - sm->nodes,
		n->stripId,
		n->e[0].node,
		n->e[0].isStrip,
		n->e[1].node,
		n->e[1].isStrip,
		n->e[2].node,
		n->e[2].isStrip,
		n->v[0],
		n->v[1],
		n->v[2]);
}